

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

_Bool spell_okay_list(player *p,_func__Bool_player_ptr_wchar_t *spell_test,int *spells,
                     wchar_t n_spells)

{
  _Bool _Var1;
  _Bool _Var2;
  ulong uVar3;
  
  if (n_spells < L'\x01') {
    _Var2 = false;
  }
  else {
    uVar3 = 0;
    _Var2 = false;
    do {
      _Var1 = (*spell_test)(p,spells[uVar3]);
      _Var2 = (_Bool)(_Var2 | _Var1);
      uVar3 = uVar3 + 1;
    } while ((uint)n_spells != uVar3);
  }
  return _Var2;
}

Assistant:

bool spell_okay_list(const struct player *p,
		bool (*spell_test)(const struct player *p, int spell),
		const int spells[], int n_spells)
{
	int i;
	bool okay = false;

	for (i = 0; i < n_spells; i++)
		if (spell_test(p, spells[i]))
			okay = true;

	return okay;
}